

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O3

int __thiscall Shortcut_Button::handle(Shortcut_Button *this,int e)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  
  (this->super_Fl_Button).super_Fl_Widget.when_ = '\0';
  (this->super_Fl_Button).super_Fl_Widget.type_ = '\x01';
  if (e == 6) {
    iVar2 = (int)(this->super_Fl_Button).value_;
  }
  else if (e == 7) {
    uVar3 = (this->super_Fl_Button).super_Fl_Widget.flags_;
    Fl_Button::value(&this->super_Fl_Button,0);
    iVar2 = 1;
    if ((char)uVar3 < '\0') {
      puVar1 = &(this->super_Fl_Button).super_Fl_Widget.flags_;
      *(byte *)puVar1 = (byte)*puVar1 | 0x80;
    }
  }
  else if (e == 8) {
    if ((this->super_Fl_Button).value_ == '\0') {
      iVar2 = 0;
    }
    else {
      uVar3 = (uint)*Fl::e_text;
      if ((byte)(*Fl::e_text - 0x21U) < 0x5e) {
        iVar2 = isupper(uVar3);
        if (iVar2 != 0) {
          uVar3 = tolower(uVar3);
          uVar3 = uVar3 | 0x10000;
        }
        uVar3 = Fl::e_state & 0x4c0000U | uVar3;
      }
      else {
        uVar3 = Fl::e_state & 0x4d0000U | Fl::e_keysym;
        if ((uVar3 == 0xff08) && (uVar3 = 0xff08, this->svalue != 0)) {
          uVar3 = 0;
        }
      }
      iVar2 = 1;
      if (uVar3 != this->svalue) {
        this->svalue = uVar3;
        puVar1 = &(this->super_Fl_Button).super_Fl_Widget.flags_;
        *(byte *)puVar1 = (byte)*puVar1 | 0x80;
        Fl_Widget::redraw((Fl_Widget *)this);
        Fl_Widget::do_callback
                  ((Fl_Widget *)this,(Fl_Widget *)this,
                   (this->super_Fl_Button).super_Fl_Widget.user_data_);
      }
    }
  }
  else {
    iVar2 = Fl_Button::handle(&this->super_Fl_Button,e);
    if (((e == 2) && ((this->super_Fl_Button).value_ != '\0')) &&
       ((Shortcut_Button *)Fl::focus_ != this)) {
      Fl_Widget::take_focus((Fl_Widget *)this);
    }
  }
  return iVar2;
}

Assistant:

int Shortcut_Button::handle(int e) {
  when(0); type(FL_TOGGLE_BUTTON);
  if (e == FL_KEYBOARD) {
    if (!value()) return 0;
    int v = Fl::event_text()[0];
    if ( (v > 32 && v < 0x7f) || (v > 0xa0 && v <= 0xff) ) {
      if (isupper(v)) {
        v = tolower(v);
        v |= FL_SHIFT;
      }
      v = v | (Fl::event_state()&(FL_META|FL_ALT|FL_CTRL));
    } else {
      v = (Fl::event_state()&(FL_META|FL_ALT|FL_CTRL|FL_SHIFT)) | Fl::event_key();
      if (v == FL_BackSpace && svalue) v = 0;
    }
    if (v != svalue) {svalue = v; set_changed(); redraw(); do_callback(); }
    return 1;
  } else if (e == FL_UNFOCUS) {
    int c = changed(); value(0); if (c) set_changed();
    return 1;
  } else if (e == FL_FOCUS) {
    return value();
  } else {
    int r = Fl_Button::handle(e);
    if (e == FL_RELEASE && value() && Fl::focus() != this) take_focus();
    return r;
  }
}